

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

InterpreterStackFrame * __thiscall ThreadContext::PopInterpreterFrame(ThreadContext *this)

{
  InterpreterStackFrame *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InterpreterStackFrame *pIVar4;
  InterpreterStackFrame *interpreterFrame;
  ThreadContext *this_local;
  
  this_00 = this->leafInterpreterFrame;
  if (this_00 == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x76f,"(interpreterFrame)","interpreterFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pIVar4 = Js::InterpreterStackFrame::GetPreviousFrame(this_00);
  this->leafInterpreterFrame = pIVar4;
  return this_00;
}

Assistant:

Js::InterpreterStackFrame *
ThreadContext::PopInterpreterFrame()
{
    Js::InterpreterStackFrame *interpreterFrame = this->leafInterpreterFrame;
    Assert(interpreterFrame);
    this->leafInterpreterFrame = interpreterFrame->GetPreviousFrame();
    return interpreterFrame;
}